

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

bool __thiscall BasePort::CheckFwBusGeneration(BasePort *this,string *caller,bool doScan)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  
  bVar1 = true;
  if (this->FwBusGeneration != this->newFwBusGeneration) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->outStr,(caller->_M_dataplus)._M_p,caller->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,": Firewire bus reset, old generation = ",0x27);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", new generation = ",0x13);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if (doScan) {
      iVar2 = (*this->_vptr_BasePort[0x1c])(this,caller);
      return SUB41(iVar2,0);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool BasePort::CheckFwBusGeneration(const std::string &caller, bool doScan)
{
    bool ret = (FwBusGeneration == newFwBusGeneration);
    if (!ret) {
        outStr << caller << ": Firewire bus reset, old generation = " << FwBusGeneration
               << ", new generation = " << newFwBusGeneration << std::endl;
        if (doScan)
            ret = ReScanNodes(caller);
    }
    return ret;
}